

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

double nk_pow(double x,int n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  uVar1 = -n;
  if (0 < n) {
    uVar1 = n;
  }
  dVar3 = 10.0;
  dVar2 = 1.0;
  for (; uVar1 != 0; uVar1 = uVar1 >> 1) {
    if ((uVar1 & 1) != 0) {
      dVar2 = dVar2 * dVar3;
    }
    dVar3 = dVar3 * dVar3;
  }
  if (n < 0) {
    dVar2 = 1.0 / dVar2;
  }
  return dVar2;
}

Assistant:

NK_INTERN double
nk_pow(double x, int n)
{
    /*  check the sign of n */
    double r = 1;
    int plus = n >= 0;
    n = (plus) ? n : -n;
    while (n > 0) {
        if ((n & 1) == 1)
            r *= x;
        n /= 2;
        x *= x;
    }
    return plus ? r : 1.0 / r;
}